

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_font_x.cxx
# Opt level: O2

void __thiscall
Fl_Xlib_Graphics_Driver::font(Fl_Xlib_Graphics_Driver *this,Fl_Font fnum,Fl_Fontsize size)

{
  Fl_Font_Descriptor **ppFVar1;
  char *name;
  Fl_Font_Descriptor *this_00;
  Fl_Fontdesc *pFVar2;
  
  if (fnum == -1) {
    (this->super_Fl_Graphics_Driver).font_ = 0;
    (this->super_Fl_Graphics_Driver).size_ = 0;
  }
  else if (((this->super_Fl_Graphics_Driver).font_ != fnum) ||
          ((this->super_Fl_Graphics_Driver).size_ != size)) {
    (this->super_Fl_Graphics_Driver).font_ = fnum;
    (this->super_Fl_Graphics_Driver).size_ = size;
    pFVar2 = fl_fonts + fnum;
    if (fl_fonts[fnum].name == (char *)0x0) {
      pFVar2 = fl_fonts;
    }
    ppFVar1 = &pFVar2->first;
    this_00 = (Fl_Font_Descriptor *)ppFVar1;
    do {
      this_00 = this_00->next;
      if (this_00 == (Fl_Font_Descriptor *)0x0) {
        fl_open_display();
        name = put_font_size(pFVar2->name,size);
        this_00 = (Fl_Font_Descriptor *)operator_new(0x60);
        Fl_Font_Descriptor::Fl_Font_Descriptor(this_00,name);
        this_00->size = size;
        this_00->next = *ppFVar1;
        *ppFVar1 = this_00;
        free(name);
        break;
      }
    } while (this_00->size != size);
    if (this_00 != (this->super_Fl_Graphics_Driver).font_descriptor_) {
      (this->super_Fl_Graphics_Driver).font_descriptor_ = this_00;
      fl_xfont.ptr = *this_00->font->fonts;
      font_gc = (GC)0x0;
    }
  }
  return;
}

Assistant:

void Fl_Xlib_Graphics_Driver::font(Fl_Font fnum, Fl_Fontsize size) {
  if (fnum==-1) {
    Fl_Graphics_Driver::font(0, 0);
    return;
  }
  if (fnum == Fl_Graphics_Driver::font() && size == Fl_Graphics_Driver::size()) return;
  Fl_Graphics_Driver::font(fnum, size);
  Fl_Font_Descriptor* f = find(fnum, size);
  if (f != this->font_descriptor()) {
    this->font_descriptor(f);
    fl_xfont = f->font->fonts[0];
    font_gc = 0;
  }
}